

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCall
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Call *curr)

{
  size_t sVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  Literal *pLVar5;
  Name NVar6;
  string_view name;
  SmallVector<wasm::Literal,_1UL> local_130;
  undefined1 local_f8 [32];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_d8;
  undefined1 local_c0 [8];
  Flow flow;
  Literals arguments;
  HeapType local_38;
  
  name = (curr->target).super_IString.str;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  flow.breakTo.super_IString.str._M_str = (char *)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_c0,&this->super_ExpressionRunner<wasm::ModuleRunner>,&curr->operands,
             (Literals *)&flow.breakTo.super_IString.str._M_str);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    NVar6.super_IString.str._M_str = (char *)(curr->target).super_IString.str._M_len;
    NVar6.super_IString.str._M_len = (size_t)this->wasm;
    lVar4 = wasm::Module::getFunction(NVar6);
    local_38.id = *(uintptr_t *)(lVar4 + 0x38);
    local_f8._0_8_ = (this->super_ExpressionRunner<wasm::ModuleRunner>).module;
    cVar3 = wasm::Intrinsics::isCallWithoutEffects((Function *)local_f8);
    if (cVar3 != '\0') {
      pLVar5 = SmallVector<wasm::Literal,_1UL>::back
                         ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str)
      ;
      name = (string_view)Literal::getFunc(pLVar5);
      pLVar5 = SmallVector<wasm::Literal,_1UL>::back
                         ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str)
      ;
      local_38 = Type::getHeapType(&pLVar5->type);
      SmallVector<wasm::Literal,_1UL>::pop_back
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    }
    if (curr->isReturn == true) {
      Literal::Literal((Literal *)local_f8,(Name)name,local_38);
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str,
                 (Literal *)local_f8);
      wasm::Literal::~Literal((Literal *)local_f8);
      pcVar2 = _compare;
      sVar1 = RETURN_CALL_FLOW;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)flow.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&arguments);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
    }
    else {
      SmallVector<wasm::Literal,_1UL>::SmallVector
                (&local_130,
                 (SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
      callFunction((Literals *)local_f8,this,(Name)name,(Literals *)&local_130);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           local_f8._0_8_;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)(local_f8 + 8));
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_d8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_d8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_d8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_d8);
      wasm::Literal::~Literal((Literal *)(local_f8 + 8));
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_130.flexible);
      wasm::Literal::~Literal(local_130.fixed._M_elems);
    }
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_c0;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&flow);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&arguments);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCall(Call* curr) {
    NOTE_ENTER("Call");
    NOTE_NAME(curr->target);
    Name target = curr->target;
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    auto* func = wasm.getFunction(curr->target);
    auto funcType = func->type;
    if (Intrinsics(*self()->getModule()).isCallWithoutEffects(func)) {
      // The call.without.effects intrinsic is a call to an import that actually
      // calls the given function reference that is the final argument.
      target = arguments.back().getFunc();
      funcType = arguments.back().type.getHeapType();
      arguments.pop_back();
    }

    if (curr->isReturn) {
      // Return calls are represented by their arguments followed by a reference
      // to the function to be called.
      arguments.push_back(Literal::makeFunc(target, funcType));
      return Flow(RETURN_CALL_FLOW, std::move(arguments));
    }

    Flow ret = callFunction(target, arguments);
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "(returned to " << scope->function->name << ")\n";
#endif
    return ret;
  }